

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O0

void __thiscall p2t::Triangle::SetDelunayEdgeCCW(Triangle *this,Point *p,bool e)

{
  bool e_local;
  Point *p_local;
  Triangle *this_local;
  
  if (p == this->points_[0]) {
    this->delaunay_edge[2] = e;
  }
  else if (p == this->points_[1]) {
    this->delaunay_edge[0] = e;
  }
  else {
    this->delaunay_edge[1] = e;
  }
  return;
}

Assistant:

void Triangle::SetDelunayEdgeCCW(const Point& p, bool e)
{
  if (&p == points_[0]) {
    delaunay_edge[2] = e;
  } else if (&p == points_[1]) {
    delaunay_edge[0] = e;
  } else {
    delaunay_edge[1] = e;
  }
}